

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler.hpp
# Opt level: O0

FailCodeType __thiscall
mittens::
GenericExceptionHandler<void,_mittens::GenericExceptionHandler<int,_mittens::UnHandler<int>,_mittens::DefaultNoAction<int>_>,_mittens::DefaultNoAction<void>_>
::handleException(GenericExceptionHandler<void,_mittens::GenericExceptionHandler<int,_mittens::UnHandler<int>,_mittens::DefaultNoAction<int>_>,_mittens::DefaultNoAction<void>_>
                  *this)

{
  FailCodeType FVar1;
  GenericExceptionHandler<void,_mittens::GenericExceptionHandler<int,_mittens::UnHandler<int>,_mittens::DefaultNoAction<int>_>,_mittens::DefaultNoAction<void>_>
  *this_local;
  
  FVar1 = GenericExceptionHandler<int,_mittens::UnHandler<int>,_mittens::DefaultNoAction<int>_>::
          operator()(&this->nestedHandler);
  return FVar1;
}

Assistant:

FailCodeType handleException()
      {
         try
         {
            return nestedHandler();
         }
         catch (...)
         {            
            try 
            { 
               // Run custom action. 
               // If the return type of the custom action is the same as FailCodeType (as opposed to void or even less plausible something else)
               // then return the result of custom action as the fail code.
               using ReturnActionResult = typename std::is_same< FailCodeType, decltype(customAction_())>::type;
               return runAction(ReturnActionResult{});
            }
            catch (...) 
            { 
               // Force the action no-throw by suppressing any exceptions unless requested not to.
               if (!supressExceptionsInAction_)
                  throw; 
            } 
            return failCode_;
         }
      }